

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_init_eb2.cpp
# Opt level: O2

void __thiscall NavierStokesBase::initialize_eb2_structs(NavierStokesBase *this)

{
  FabArray<amrex::BaseFab<int>_> *this_00;
  Box *this_01;
  int iVar1;
  int iVar2;
  BaseFab<int> *pBVar3;
  EBCellFlagFab *this_02;
  EBCellFlag *pEVar4;
  bool bVar5;
  FabType FVar6;
  int iVar7;
  ostream *poVar8;
  EBFArrayBoxFactory *this_03;
  MultiFab *pMVar9;
  MultiCutFab *pMVar10;
  FabArray<amrex::EBCellFlagFab> *pFVar11;
  int *piVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  Box bx;
  MFIter mfi;
  Box tbox;
  BoxIterator bit;
  int iStack_194;
  int local_190;
  
  poVar8 = amrex::OutStream();
  amrex::Print::Print((Print *)&bit,poVar8);
  poVar8 = (ostream *)(bit.m_boxLo.vect + 1);
  std::operator<<(poVar8,"Initializing EB2 structs");
  std::endl<char,std::char_traits<char>>(poVar8);
  amrex::Print::~Print((Print *)&bit);
  no_eb_in_domain = false;
  this_00 = &this->ebmask;
  bit.m_current.vect[0] = 1;
  bit.m_current.vect[1] = 0;
  bit.m_current.vect[2] = 0;
  bit.m_boxLo.vect[0] = 0;
  bit.m_boxLo.vect[1] = 0;
  bit.m_boxLo.vect[2] = 0;
  bit.m_boxHi.vect[0] = 0;
  bit.m_boxHi.vect[1] = 0;
  stack0xfffffffffffffe68 = (pointer)0x0;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       &PTR__FabFactory_006d8c40;
  amrex::FabArray<amrex::BaseFab<int>_>::define
            (this_00,&(this->super_AmrLevel).grids,&(this->super_AmrLevel).dmap,1,0,(MFInfo *)&bit,
             (FabFactory<amrex::BaseFab<int>_> *)&mfi);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(bit.m_boxLo.vect + 1));
  this_03 = (EBFArrayBoxFactory *)
            __dynamic_cast((this->super_AmrLevel).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                           &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (this_03 != (EBFArrayBoxFactory *)0x0) {
    pMVar9 = amrex::EBFArrayBoxFactory::getVolFrac(this_03);
    this->volfrac = pMVar9;
    pMVar10 = amrex::EBFArrayBoxFactory::getBndryCent(this_03);
    this->bndrycent = pMVar10;
    amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&bit,this_03);
    (this->areafrac)._M_elems[2] = (MultiCutFab *)bit.m_boxLo.vect._4_8_;
    (this->areafrac)._M_elems[0] = (MultiCutFab *)bit.m_current.vect._0_8_;
    (this->areafrac)._M_elems[1] = (MultiCutFab *)bit._8_8_;
    amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&bit,this_03);
    (this->facecent)._M_elems[2] = (MultiCutFab *)bit.m_boxLo.vect._4_8_;
    (this->facecent)._M_elems[0] = (MultiCutFab *)bit.m_current.vect._0_8_;
    (this->facecent)._M_elems[1] = (MultiCutFab *)bit._8_8_;
    pFVar11 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab(this_03);
    amrex::MFIter::MFIter(&mfi,(FabArrayBase *)this->volfrac,false);
    while (mfi.currentIndex < mfi.endIndex) {
      iVar13 = mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        iVar13 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[mfi.currentIndex];
      }
      pBVar3 = (this->ebmask).m_fabs_v.
               super__Vector_base<amrex::BaseFab<int>_*,_std::allocator<amrex::BaseFab<int>_*>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar13];
      amrex::MFIter::growntilebox(&tbox,&mfi,-1000000);
      amrex::MFIter::tilebox(&bx,&mfi);
      piVar12 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar12 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      this_02 = (pFVar11->m_fabs_v).
                super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
                _M_impl.super__Vector_impl_data._M_start[*piVar12];
      FVar6 = amrex::EBCellFlagFab::getType(this_02,&tbox);
      if (FVar6 == covered) {
        amrex::FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>
                  ((Array4<int> *)&bit,this_00,&mfi);
        for (lVar17 = (long)bx.smallend.vect[2]; lVar17 <= bx.bigend.vect[2]; lVar17 = lVar17 + 1) {
          for (lVar16 = (long)bx.smallend.vect[1]; lVar16 <= bx.bigend.vect[1]; lVar16 = lVar16 + 1)
          {
            if (bx.smallend.vect[0] <= bx.bigend.vect[0]) {
              iVar13 = bx.smallend.vect[0] - bit.m_boxHi.vect[2];
              iVar14 = (bx.bigend.vect[0] - bx.smallend.vect[0]) + 1;
              do {
                *(undefined4 *)
                 ((lVar16 - iStack_194) * bit._8_8_ * 4 +
                  bit.m_current.vect._0_8_ + (lVar17 - local_190) * bit.m_boxLo.vect._4_8_ * 4 +
                 (long)iVar13 * 4) = 0xffffffff;
                iVar13 = iVar13 + 1;
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
            }
          }
        }
      }
      else if (FVar6 == singlevalued) {
        amrex::BoxIterator::BoxIterator(&bit,&tbox);
        this_01 = &(this_02->super_BaseFab<amrex::EBCellFlag>).domain;
        while (bVar5 = amrex::BoxIterator::ok(&bit), bVar5) {
          amrex::Box::numPts(this_01);
          iVar13 = bit.m_current.vect[0];
          iVar14 = bit.m_current.vect[1];
          bit.m_current.vect[0] = bit.m_current.vect[0] + 1;
          if (bit.m_boxHi.vect[0] <= iVar13) {
            bit.m_current.vect[1] = bit.m_current.vect[1] + 1;
            bit.m_current.vect[0] = bit.m_boxLo.vect[0];
            if (bit.m_boxHi.vect[1] <= iVar14) {
              bit.m_current.vect[1] = bit.m_boxLo.vect[1];
              bit.m_current.vect[2] = bit.m_current.vect[2] + 1;
            }
          }
        }
        amrex::BoxIterator::BoxIterator(&bit,&tbox);
        while (bVar5 = amrex::BoxIterator::ok(&bit), bVar5) {
          lVar17 = (long)bit.m_current.vect[0];
          iVar13 = (this_02->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
          iVar14 = (this_02->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
          iVar1 = (this_02->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
          iVar7 = bit.m_current.vect[1] - iVar14;
          iVar15 = bit.m_current.vect[2] -
                   (this_02->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
          iVar2 = (this_02->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1];
          pEVar4 = (this_02->super_BaseFab<amrex::EBCellFlag>).dptr;
          amrex::Box::numPts(this_01);
          uVar18 = pEVar4[(lVar17 - iVar13) +
                          (long)((((iVar2 - iVar14) + 1) * iVar15 + iVar7) * ((iVar1 - iVar13) + 1))
                         ].flag;
          bVar5 = amrex::Box::contains(&pBVar3->domain,&bit.m_current);
          uVar18 = uVar18 & 3;
          if (uVar18 == 0) {
            iVar13 = 1;
          }
          else if (uVar18 == 3) {
            iVar13 = -1;
          }
          else {
            iVar13 = 0;
          }
          iVar14 = bit.m_current.vect[0];
          iVar1 = bit.m_current.vect[1];
          if (bVar5) {
            iVar2 = (pBVar3->domain).smallend.vect[0];
            iVar7 = *(int *)((long)(pBVar3->domain).smallend.vect + 4);
            pBVar3->dptr
            [((long)bit.m_current.vect[0] - (long)iVar2) +
             (long)((((*(int *)((long)(pBVar3->domain).bigend.vect + 4) - iVar7) + 1) *
                     (bit.m_current.vect[2] - *(int *)((long)(pBVar3->domain).smallend.vect + 8)) +
                    (bit.m_current.vect[1] - iVar7)) *
                   (((pBVar3->domain).bigend.vect[0] - iVar2) + 1))] = iVar13;
          }
          bit.m_current.vect[0] = bit.m_current.vect[0] + 1;
          if (bit.m_boxHi.vect[0] <= iVar14) {
            bit.m_current.vect[1] = bit.m_current.vect[1] + 1;
            bit.m_current.vect[0] = bit.m_boxLo.vect[0];
            if (bit.m_boxHi.vect[1] <= iVar1) {
              bit.m_current.vect[1] = bit.m_boxLo.vect[1];
              bit.m_current.vect[2] = bit.m_current.vect[2] + 1;
            }
          }
        }
      }
      else if (FVar6 == regular) {
        amrex::FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>
                  ((Array4<int> *)&bit,this_00,&mfi);
        for (lVar17 = (long)bx.smallend.vect[2]; lVar17 <= bx.bigend.vect[2]; lVar17 = lVar17 + 1) {
          for (lVar16 = (long)bx.smallend.vect[1]; lVar16 <= bx.bigend.vect[1]; lVar16 = lVar16 + 1)
          {
            if (bx.smallend.vect[0] <= bx.bigend.vect[0]) {
              iVar13 = bx.smallend.vect[0] - bit.m_boxHi.vect[2];
              iVar14 = (bx.bigend.vect[0] - bx.smallend.vect[0]) + 1;
              do {
                *(undefined4 *)
                 ((lVar16 - iStack_194) * bit._8_8_ * 4 +
                  bit.m_current.vect._0_8_ + (lVar17 - local_190) * bit.m_boxLo.vect._4_8_ * 4 +
                 (long)iVar13 * 4) = 1;
                iVar13 = iVar13 + 1;
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
            }
          }
        }
      }
      else {
        poVar8 = amrex::OutStream();
        amrex::Print::Print((Print *)&bit,poVar8);
        poVar8 = (ostream *)(bit.m_boxLo.vect + 1);
        std::operator<<(poVar8,"unknown (or multivalued) fab type");
        std::endl<char,std::char_traits<char>>(poVar8);
        amrex::Print::~Print((Print *)&bit);
        amrex::Abort_host((char *)0x0);
      }
      amrex::MFIter::operator++(&mfi);
    }
    amrex::MFIter::~MFIter(&mfi);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
NavierStokesBase::initialize_eb2_structs() {

  amrex::Print() << "Initializing EB2 structs" << std::endl;

  // NOTE: THIS NEEDS TO BE REPLACED WITH A FLAGFAB 
  
  // n.b., could set this to 1 if geometry is all_regular as an optimization
  no_eb_in_domain = 0;

  //  1->regular, 0->irregular, -1->covered, 2->outside
  ebmask.define(grids, dmap,  1, 0);
  
  const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Factory());

  // These are the data sources
  volfrac = &(ebfactory.getVolFrac());
  bndrycent = &(ebfactory.getBndryCent());
  areafrac = ebfactory.getAreaFrac();
  facecent = ebfactory.getFaceCent();
  
  auto const& flags = ebfactory.getMultiEBCellFlagFab();

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
  for (MFIter mfi(*volfrac, false); mfi.isValid(); ++mfi)
  {
    BaseFab<int>& mfab = ebmask[mfi];
    const Box tbox = mfi.growntilebox();
    const Box bx = mfi.tilebox();
    const EBCellFlagFab& flagfab = flags[mfi];
    
    FabType typ = flagfab.getType(tbox);

    if (typ == FabType::regular) {
      const auto& mask = ebmask.array(mfi);
      amrex::ParallelFor(bx, [mask]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
          mask(i,j,k) = 1;
      });
    }
    else if (typ == FabType::covered) {
      const auto& mask = ebmask.array(mfi);
      amrex::ParallelFor(bx, [mask]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
          mask(i,j,k) = -1;
      });
    }
    else if (typ == FabType::singlevalued) {
      int Ncut = 0;
      for (BoxIterator bit(tbox); bit.ok(); ++bit) {
        const EBCellFlag& flag = flagfab(bit(), 0);
    
        if (!(flag.isRegular() || flag.isCovered())) {
          Ncut++;
        }
      }
    
      for (BoxIterator bit(tbox); bit.ok(); ++bit) {
        const EBCellFlag& flag = flagfab(bit(), 0);
    
        if (!(flag.isRegular() || flag.isCovered())) {
          if (mfab.box().contains(bit())) mfab(bit()) = 0;
        } else {
          if (flag.isRegular()) {
            if (mfab.box().contains(bit())) mfab(bit()) = 1;
          } else if (flag.isCovered()) {
            if (mfab.box().contains(bit())) mfab(bit()) = -1;
          } else {
            if (mfab.box().contains(bit())) mfab(bit()) = 2;
          }
        }
      }
    }
    else {
      amrex::Print() << "unknown (or multivalued) fab type" << std::endl;
      amrex::Abort();
    }   
  }
}